

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  Btree *p;
  BtCursor *pBt;
  BtCursor *pBVar1;
  BtCursor *pBVar2;
  int in_EAX;
  int extraout_EAX;
  BtCursor *pBVar3;
  long lVar4;
  
  p = pCur->pBtree;
  if (p == (Btree *)0x0) {
    return in_EAX;
  }
  pBt = (BtCursor *)pCur->pBt;
  sqlite3BtreeEnter(p);
  sqlite3BtreeClearCursor(pCur);
  pBVar3 = pBt->pNext;
  pBVar2 = pBt;
  if (pBt->pNext == pCur) {
LAB_0022a124:
    pBVar2->pNext = pCur->pNext;
  }
  else {
    do {
      pBVar1 = pBVar3->pNext;
      pBVar2 = pBVar3;
      if (pBVar1 == pCur) goto LAB_0022a124;
      pBVar3 = pBVar1;
    } while (pBVar1 != (BtCursor *)0x0);
  }
  for (lVar4 = 0; lVar4 <= pCur->iPage; lVar4 = lVar4 + 1) {
    releasePage(pCur->apPage[lVar4]);
  }
  unlockBtreeIfUnused((BtShared *)pBt);
  sqlite3_free(pCur->aOverflow);
  sqlite3BtreeLeave(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}